

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

ostream * absl::lts_20250127::operator<<(ostream *os,int128 v)

{
  uint uVar1;
  ostream oVar2;
  ostream *poVar3;
  char cVar4;
  char *pcVar5;
  long in_RDX;
  long lVar6;
  void *in_RSI;
  void *this;
  ulong uVar7;
  fmtflags in_R8D;
  uint uVar8;
  size_t count;
  long lVar9;
  uint128 v_00;
  char *local_70;
  ulong local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  uVar8 = uVar1 & 0x4a;
  lVar6 = in_RDX;
  this = in_RSI;
  if ((uVar1 & 0x48) == 0) {
    if (in_RDX < 0) {
      pcVar5 = "-";
LAB_0039e6dd:
      in_R8D = _S_boolalpha;
      std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar5);
    }
    else if ((uVar1 >> 0xb & 1) != 0) {
      pcVar5 = "+";
      goto LAB_0039e6dd;
    }
    if (((uVar1 & 0x48) == 0) && (in_RDX < 0)) {
      lVar6 = -(ulong)(in_RSI != (void *)0x0) - in_RDX;
      this = (void *)-(long)in_RSI;
    }
  }
  v_00.hi_._0_4_ = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  v_00.lo_ = lVar6;
  v_00.hi_._4_4_ = 0;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_(&local_50,this,v_00,in_R8D);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar6 = *(long *)os;
  uVar7 = *(ulong *)(os + *(long *)(lVar6 + -0x18) + 0x10);
  *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 0x10) = 0;
  lVar9 = uVar7 - local_68;
  if (uVar7 < local_68 || lVar9 == 0) goto LAB_0039e8e7;
  cVar4 = (char)lVar9;
  if (((byte)uVar1 & 0xb0) == 0x10) {
    if (uVar8 == 0) {
LAB_0039e7f3:
      if ((*local_70 != '-') && (*local_70 != '+')) {
        if ((uVar1 & 0x24a) == 0x208) {
LAB_0039e86e:
          if (in_RSI != (void *)0x0 || in_RDX != 0) {
            poVar3 = os + *(long *)(lVar6 + -0x18);
            uVar7 = 2;
            if (os[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
              oVar2 = (ostream)std::ios::widen((char)poVar3);
              uVar7 = 2;
              goto LAB_0039e8c3;
            }
            goto LAB_0039e8d2;
          }
        }
        goto LAB_0039e89e;
      }
      poVar3 = os + *(long *)(lVar6 + -0x18);
      uVar7 = 1;
      if (os[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        uVar7 = 1;
        goto LAB_0039e8c3;
      }
    }
    else {
      if (uVar8 == 8) {
        if ((uVar1 >> 9 & 1) != 0) goto LAB_0039e86e;
      }
      else if (uVar8 == 2) goto LAB_0039e7f3;
LAB_0039e89e:
      poVar3 = os + *(long *)(lVar6 + -0x18);
      if (os[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        goto LAB_0039e8c1;
      }
LAB_0039e8b0:
      uVar7 = 0;
    }
  }
  else {
    if ((uVar1 & 0xb0) == 0x20) {
      poVar3 = os + *(long *)(lVar6 + -0x18);
      if (os[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        poVar3[0xe0] = oVar2;
        poVar3[0xe1] = (ostream)0x1;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,cVar4);
      goto LAB_0039e8e7;
    }
    poVar3 = os + *(long *)(lVar6 + -0x18);
    if (os[*(long *)(lVar6 + -0x18) + 0xe1] != (ostream)0x0) goto LAB_0039e8b0;
    oVar2 = (ostream)std::ios::widen((char)poVar3);
LAB_0039e8c1:
    uVar7 = 0;
LAB_0039e8c3:
    poVar3[0xe0] = oVar2;
    poVar3[0xe1] = (ostream)0x1;
  }
LAB_0039e8d2:
  std::__cxx11::string::insert((ulong)&local_70,uVar7,cVar4);
LAB_0039e8e7:
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_70,local_68);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, int128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep;

  // Add the sign if needed.
  bool print_as_decimal =
      (flags & std::ios::basefield) == std::ios::dec ||
      (flags & std::ios::basefield) == std::ios_base::fmtflags();
  if (print_as_decimal) {
    if (Int128High64(v) < 0) {
      rep = "-";
    } else if (flags & std::ios::showpos) {
      rep = "+";
    }
  }

  rep.append(Uint128ToFormattedString(
      print_as_decimal ? UnsignedAbsoluteValue(v) : uint128(v), os.flags()));

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    switch (flags & std::ios::adjustfield) {
      case std::ios::left:
        rep.append(count, os.fill());
        break;
      case std::ios::internal:
        if (print_as_decimal && (rep[0] == '+' || rep[0] == '-')) {
          rep.insert(size_t{1}, count, os.fill());
        } else if ((flags & std::ios::basefield) == std::ios::hex &&
                   (flags & std::ios::showbase) && v != 0) {
          rep.insert(size_t{2}, count, os.fill());
        } else {
          rep.insert(size_t{0}, count, os.fill());
        }
        break;
      default:  // std::ios::right
        rep.insert(size_t{0}, count, os.fill());
        break;
    }
  }

  return os << rep;
}